

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::EmitterBeam::EmitterBeam
          (EmitterBeam *this,KUINT8 BeamID,KUINT16 BeamParamIndex,FundamentalParameterData *FPD,
          EmitterFunction EBF,HighDensityTrackJam HDTJ,BeamStatus *BS,JammingTechnique *JT)

{
  KFLOAT32 KVar1;
  KFLOAT32 KVar2;
  KFLOAT32 KVar3;
  KFLOAT32 KVar4;
  KFLOAT32 KVar5;
  KFLOAT32 KVar6;
  KFLOAT32 KVar7;
  KUINT8 KVar8;
  KUINT8 KVar9;
  KUINT8 KVar10;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_00229f00;
  this->m_ui8BeamDataLength = '\r';
  this->m_ui8EmitterBeamIDNumber = BeamID;
  this->m_ui16BeamParamIndex = BeamParamIndex;
  (this->m_FundamentalParameterData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022a0a8;
  KVar1 = FPD->m_f32FreqRange;
  KVar2 = FPD->m_f32EffectiveRadiatedPower;
  KVar3 = FPD->m_f32PulseRepetitionFreq;
  KVar4 = FPD->m_f32PulseWidth;
  KVar5 = FPD->m_f32BeamAzimuthCenter;
  KVar6 = FPD->m_f32BeamAzimuthSweep;
  KVar7 = FPD->m_f32BeamElevationCenter;
  (this->m_FundamentalParameterData).m_f32Freq = FPD->m_f32Freq;
  (this->m_FundamentalParameterData).m_f32FreqRange = KVar1;
  (this->m_FundamentalParameterData).m_f32EffectiveRadiatedPower = KVar2;
  (this->m_FundamentalParameterData).m_f32PulseRepetitionFreq = KVar3;
  (this->m_FundamentalParameterData).m_f32PulseWidth = KVar4;
  (this->m_FundamentalParameterData).m_f32BeamAzimuthCenter = KVar5;
  (this->m_FundamentalParameterData).m_f32BeamAzimuthSweep = KVar6;
  (this->m_FundamentalParameterData).m_f32BeamElevationCenter = KVar7;
  KVar1 = FPD->m_f32BeamSweepSync;
  (this->m_FundamentalParameterData).m_f32BeamElevationSweep = FPD->m_f32BeamElevationSweep;
  (this->m_FundamentalParameterData).m_f32BeamSweepSync = KVar1;
  this->m_ui8BeamFunction = (KUINT8)EBF;
  this->m_ui8NumTargetInTrackJamField = '\0';
  this->m_ui8HighDensityTrackJam = (KUINT8)HDTJ;
  (this->m_BeamStatus).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__BeamStatus_0022bdb0;
  (this->m_BeamStatus).m_ui8BeamStatus = BS->m_ui8BeamStatus;
  (this->m_JammingTechnique).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__JammingTechnique_0022bf20;
  KVar8 = JT->m_ui8Category;
  KVar9 = JT->m_ui8Subcategory;
  KVar10 = JT->m_ui8Specific;
  (this->m_JammingTechnique).m_ui8Kind = JT->m_ui8Kind;
  (this->m_JammingTechnique).m_ui8Category = KVar8;
  (this->m_JammingTechnique).m_ui8Subcategory = KVar9;
  (this->m_JammingTechnique).m_ui8Specific = KVar10;
  (this->m_vTrackJamTargets).
  super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vTrackJamTargets).
  super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vTrackJamTargets).
  super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EmitterBeam::EmitterBeam( KUINT8 BeamID, KUINT16 BeamParamIndex, const FundamentalParameterData & FPD,
                          EmitterFunction EBF, HighDensityTrackJam HDTJ,
#if DIS_VERSION < 7
                          KUINT32 JammingModeSequence ) :
#elif DIS_VERSION > 6
                          const BeamStatus & BS, const JammingTechnique & JT ) :
#endif
  DataTypeBase (),
  m_ui8BeamDataLength ( EMITTER_BEAM_SIZE / 4 ),
  m_ui8EmitterBeamIDNumber ( BeamID ),
  m_ui16BeamParamIndex ( BeamParamIndex ),
  m_FundamentalParameterData ( FPD ),
  m_ui8BeamFunction ( EBF ),
  m_ui8NumTargetInTrackJamField ( 0u ),
  m_ui8HighDensityTrackJam ( HDTJ ),
#if DIS_VERSION < 7
  m_ui8Padding ( 0u ),
  m_ui32JammingModeSequence ( JammingModeSequence ),
#elif DIS_VERSION > 6
  m_BeamStatus ( BS ),
  m_JammingTechnique ( JT ),
#endif
  m_vTrackJamTargets ()
{
}